

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitIteratorTopLevelFinally
               (ByteCodeLabel finallyLabel,RegSlot iteratorLocation,RegSlot shouldCallReturnLocation
               ,RegSlot yieldExceptionLocation,RegSlot yieldOffsetLocation,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,bool isAsync)

{
  bool bVar1;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  ByteCodeWriter *pBVar2;
  ByteCodeLabel skipCallCloseLabel;
  ByteCodeLabel afterFinallyBlockLabel;
  bool isCoroutine;
  bool isAsync_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot yieldOffsetLocation_local;
  RegSlot yieldExceptionLocation_local;
  RegSlot shouldCallReturnLocation_local;
  RegSlot iteratorLocation_local;
  ByteCodeLabel finallyLabel_local;
  
  bVar1 = Js::FunctionProxy::IsCoroutine(&funcInfo->byteCodeFunction->super_FunctionProxy);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  labelID = Js::ByteCodeWriter::DefineLabel(pBVar2);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Empty(pBVar2,Leave);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(pBVar2,false);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(pBVar2,true);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Br(pBVar2,labelID);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar2,finallyLabel);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Empty(pBVar2,Finally);
  ByteCodeGenerator::PushJumpCleanupForTry
            (byteCodeGenerator,ResumeFinally,finallyLabel,yieldExceptionLocation,yieldOffsetLocation
            );
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  labelID_00 = Js::ByteCodeWriter::DefineLabel(pBVar2);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::BrReg1(pBVar2,BrFalse_A,labelID_00,shouldCallReturnLocation);
  EmitIteratorClose(iteratorLocation,byteCodeGenerator,funcInfo,isAsync);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar2,labelID_00);
  ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  if (bVar1) {
    FuncInfo::ReleaseTmpRegister(funcInfo,yieldOffsetLocation);
    FuncInfo::ReleaseTmpRegister(funcInfo,yieldExceptionLocation);
  }
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(pBVar2,false);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Empty(pBVar2,LeaveNull);
  pBVar2 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar2,labelID);
  return;
}

Assistant:

void EmitIteratorTopLevelFinally(
    Js::ByteCodeLabel finallyLabel,
    Js::RegSlot iteratorLocation,
    Js::RegSlot shouldCallReturnLocation,
    Js::RegSlot yieldExceptionLocation,
    Js::RegSlot yieldOffsetLocation,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    bool isAsync)
{
    bool isCoroutine = funcInfo->byteCodeFunction->IsCoroutine();

    Js::ByteCodeLabel afterFinallyBlockLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);

    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(false);
    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(true);

    byteCodeGenerator->Writer()->Br(afterFinallyBlockLabel);
    byteCodeGenerator->Writer()->MarkLabel(finallyLabel);
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Finally);

    byteCodeGenerator->PushJumpCleanupForTry(
        Js::OpCode::ResumeFinally,
        finallyLabel,
        yieldExceptionLocation,
        yieldOffsetLocation);

    Js::ByteCodeLabel skipCallCloseLabel = byteCodeGenerator->Writer()->DefineLabel();

    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, skipCallCloseLabel, shouldCallReturnLocation);
    EmitIteratorClose(iteratorLocation, byteCodeGenerator, funcInfo, isAsync);

    byteCodeGenerator->Writer()->MarkLabel(skipCallCloseLabel);

    byteCodeGenerator->PopJumpCleanup();
    if (isCoroutine)
    {
        funcInfo->ReleaseTmpRegister(yieldOffsetLocation);
        funcInfo->ReleaseTmpRegister(yieldExceptionLocation);
    }

    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(false);
    byteCodeGenerator->Writer()->Empty(Js::OpCode::LeaveNull);
    byteCodeGenerator->Writer()->MarkLabel(afterFinallyBlockLabel);
}